

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O0

DenselySampledSpectrum *
pbrt::DenselySampledSpectrum::
SampleFunction<pbrt::Spectra::D(float,pstd::pmr::polymorphic_allocator<std::byte>)::__0>
          (anon_class_8_1_3fcf64fe func,int lambda_min,int lambda_max,Allocator alloc)

{
  reference pvVar1;
  int in_EDX;
  int in_ESI;
  DenselySampledSpectrum *in_RDI;
  undefined1 in_ZMM0 [64];
  int lambda;
  DenselySampledSpectrum *s;
  Float in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  Float in_stack_ffffffffffffffa4;
  DenselySampledSpectrum *pDVar2;
  DenselySampledSpectrum *in_stack_ffffffffffffffb8;
  Allocator in_stack_ffffffffffffffc0;
  int local_34;
  
  vmovlpd_avx(in_ZMM0._0_16_);
  pDVar2 = in_RDI;
  DenselySampledSpectrum
            (in_stack_ffffffffffffffb8,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
             in_stack_ffffffffffffffc0);
  for (local_34 = in_ESI; local_34 <= in_EDX; local_34 = local_34 + 1) {
    in_stack_ffffffffffffffa4 =
         Spectra::D::anon_class_8_1_3fcf64fe::operator()
                   ((anon_class_8_1_3fcf64fe *)
                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff9c);
    pvVar1 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       (&in_RDI->values,(long)(local_34 - in_ESI));
    *pvVar1 = in_stack_ffffffffffffffa4;
  }
  return pDVar2;
}

Assistant:

static DenselySampledSpectrum SampleFunction(F func, int lambda_min = Lambda_min,
                                                 int lambda_max = Lambda_max,
                                                 Allocator alloc = {}) {
        DenselySampledSpectrum s(lambda_min, lambda_max, alloc);
        for (int lambda = lambda_min; lambda <= lambda_max; ++lambda)
            s.values[lambda - lambda_min] = func(lambda);
        return s;
    }